

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_any.h
# Opt level: O2

void UnitTests::stream_any_details::output_unsigned<unsigned_long>
               (ostream *s,unsigned_long *t,int width)

{
  long lVar1;
  ostream *poVar2;
  
  poVar2 = std::operator<<(s,"0x");
  lVar1 = *(long *)poVar2;
  *(uint *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
  *(long *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = (long)width;
  *(uint *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x18) & 0xffffff4f | 0x10;
  poVar2 = std::operator<<(poVar2,0x30);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
  return;
}

Assistant:

void output_unsigned(std::ostream& s, const T& t, int width)
        {
            s << "0x" << std::hex << std::setw(width) << std::internal << std::setfill('0') << t << std::dec;
        }